

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O0

void convert_numerative_pron(char **list,NJDNode *node1,NJDNode *node2)

{
  int iVar1;
  char *pcVar2;
  NJDNode *in_RDX;
  NJDNode *in_RSI;
  long in_RDI;
  char buff [1024];
  char *str;
  int type;
  int j;
  int i;
  char *in_stack_fffffffffffffbc8;
  NJDNode *in_stack_fffffffffffffbd0;
  int local_24;
  int local_1c;
  
  local_24 = 0;
  pcVar2 = NJDNode_get_string(in_RSI);
  iVar1 = strcmp(pcVar2,"*");
  if (iVar1 != 0) {
    local_1c = 0;
    while (*(long *)(in_RDI + (long)local_1c * 8) != 0) {
      iVar1 = strcmp(*(char **)(in_RDI + (long)local_1c * 8),pcVar2);
      if (iVar1 == 0) {
        local_24 = atoi(*(char **)(in_RDI + (long)(local_1c + 1) * 8));
        break;
      }
      local_1c = local_1c + 2;
    }
    if (local_24 == 1) {
      for (local_1c = 0; njd_set_digit_rule_voiced_sound_symbol_list[local_1c] != (char *)0x0;
          local_1c = local_1c + 2) {
        pcVar2 = NJDNode_get_pron(in_RDX);
        iVar1 = strtopcmp(pcVar2,njd_set_digit_rule_voiced_sound_symbol_list[local_1c]);
        if (-1 < iVar1) {
          strcpy(&stack0xfffffffffffffbc8,njd_set_digit_rule_voiced_sound_symbol_list[local_1c + 1])
          ;
          strcat(&stack0xfffffffffffffbc8,pcVar2 + iVar1);
          NJDNode_set_pron(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
          return;
        }
      }
    }
    else if (local_24 == 2) {
      for (local_1c = 0; njd_set_digit_rule_semivoiced_sound_symbol_list[local_1c] != (char *)0x0;
          local_1c = local_1c + 2) {
        pcVar2 = NJDNode_get_pron(in_RDX);
        iVar1 = strtopcmp(pcVar2,njd_set_digit_rule_semivoiced_sound_symbol_list[local_1c]);
        if (-1 < iVar1) {
          strcpy(&stack0xfffffffffffffbc8,
                 njd_set_digit_rule_semivoiced_sound_symbol_list[local_1c + 1]);
          strcat(&stack0xfffffffffffffbc8,pcVar2 + iVar1);
          NJDNode_set_pron(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void convert_numerative_pron(const char *list[], NJDNode * node1, NJDNode * node2)
{
   int i, j;
   int type = 0;
   const char *str = NJDNode_get_string(node1);
   char buff[MAXBUFLEN];

   if (strcmp(str, "*") == 0)
      return;
   for (i = 0; list[i] != NULL; i += 2) {
      if (strcmp(list[i], str) == 0) {
         type = atoi(list[i + 1]);
         break;
      }
   }
   if (type == 1) {
      for (i = 0; njd_set_digit_rule_voiced_sound_symbol_list[i] != NULL; i += 2) {
         str = NJDNode_get_pron(node2);
         j = strtopcmp(str, njd_set_digit_rule_voiced_sound_symbol_list[i]);
         if (j >= 0) {
            strcpy(buff, njd_set_digit_rule_voiced_sound_symbol_list[i + 1]);
            strcat(buff, &str[j]);
            NJDNode_set_pron(node2, buff);
            break;
         }
      }
   } else if (type == 2) {
      for (i = 0; njd_set_digit_rule_semivoiced_sound_symbol_list[i] != NULL; i += 2) {
         str = NJDNode_get_pron(node2);
         j = strtopcmp(str, njd_set_digit_rule_semivoiced_sound_symbol_list[i]);
         if (j >= 0) {
            strcpy(buff, njd_set_digit_rule_semivoiced_sound_symbol_list[i + 1]);
            strcat(buff, &str[j]);
            NJDNode_set_pron(node2, buff);
            break;
         }
      }
   }
}